

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O1

BasicBlock * __thiscall spvtools::opt::CFG::SplitLoopHeader(CFG *this,BasicBlock *bb)

{
  Instruction **ppIVar1;
  pointer *ppuVar2;
  IRContext *pIVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> this_00;
  pointer pOVar7;
  iterator iVar8;
  _func_int **pp_Var9;
  mapped_type pLVar10;
  Function *pFVar11;
  CFG *pCVar12;
  char cVar13;
  PodType label_id;
  uint32_t uVar14;
  uint32_t uVar15;
  array<signed_char,_4UL> aVar16;
  Instruction *pIVar17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar18;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var19;
  Function *pFVar20;
  mapped_type *ppBVar21;
  mapped_type *pmVar22;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __dest;
  LoopDescriptor *pLVar23;
  _Hash_node_base *p_Var24;
  mapped_type *ppLVar25;
  pointer puVar26;
  Instruction **ppIVar27;
  ulong uVar28;
  Loop *loop;
  pointer puVar29;
  Loop *pLVar30;
  Loop *loop_2;
  Loop *pLVar31;
  long lVar32;
  ulong uVar33;
  __node_base_ptr p_Var34;
  __node_base_ptr p_Var35;
  Instruction *pIVar36;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> _Var37;
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *this_01;
  unordered_map<unsigned_int,_spvtools::opt::Loop_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>_>
  *this_02;
  IRContext *context;
  string message;
  size_type __dnew;
  IRContext *local_e8;
  Function *local_e0;
  undefined1 local_d8 [8];
  undefined1 auStack_d0 [8];
  undefined1 local_c8 [16];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_b8;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_b0;
  _Any_data local_a8;
  PodType local_98;
  PodType PStack_94;
  code **ppcStack_90;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_88;
  Function *local_78;
  CFG *local_70;
  int local_64 [3];
  initializer_list<spvtools::opt::Operand> local_58;
  Instruction **local_48;
  Instruction *local_40;
  iterator local_38;
  
  pIVar17 = BasicBlock::GetLoopMergeInst(bb);
  if (pIVar17 == (Instruction *)0x0) {
    __assert_fail("bb->GetLoopMergeInst() && \"Expecting bb to be the header of a loop.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                  ,0xc1,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
  }
  pFVar20 = bb->function_;
  pIVar3 = this->module_->context_;
  local_e8 = pIVar3;
  label_id.data._M_elems =
       (array<signed_char,_4UL>)
       Module::TakeNextIdBound
                 ((pIVar3->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  local_70 = this;
  if ((label_id.data._M_elems == (_Type)0x0) &&
     ((pIVar3->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_a8._M_unused._M_member_pointer = 0x25;
    local_d8 = (undefined1  [8])local_c8;
    local_d8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_d8,(ulong)&local_a8);
    local_c8._0_8_ = local_a8._M_unused._M_member_pointer;
    (((key_type)local_d8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    _vptr_IntrusiveNodeBase = (_func_int **)0x667265766f204449;
    (((key_type)local_d8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
         (Instruction *)0x797254202e776f6c;
    (((key_type)local_d8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
         (Instruction *)0x676e696e6e757220;
    (((key_type)local_d8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ = true;
    (((key_type)local_d8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x19 = 'c';
    (((key_type)local_d8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1a = 'o';
    (((key_type)local_d8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1b = 'm';
    (((key_type)local_d8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1c = 'p';
    (((key_type)local_d8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1d = 'a';
    (((key_type)local_d8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1e = 'c';
    (((key_type)local_d8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1f = 't';
    *(undefined8 *)
     &(((key_type)local_d8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1d =
         0x2e7364692d746361;
    auStack_d0 = (undefined1  [8])local_a8._M_unused._0_8_;
    *(char *)((long)&(((key_type)local_d8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                     _vptr_IntrusiveNodeBase + (long)local_a8._M_unused._0_8_) = '\0';
    local_a8._M_unused._M_object = (undefined **)0x0;
    local_a8._8_8_ = 0;
    local_98.data._M_elems = (array<signed_char,_4UL>)0x0;
    PStack_94.data._M_elems = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar3->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)&local_a8,(char *)local_d8);
    if (local_d8 != (undefined1  [8])local_c8) {
      operator_delete((void *)local_d8,local_c8._0_8_ + 1);
    }
  }
  pCVar12 = local_70;
  if (label_id.data._M_elems == (_Type)0x0) {
    return (BasicBlock *)(Function *)0x0;
  }
  puVar29 = (pFVar20->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (pFVar20->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar32 = (long)puVar4 - (long)puVar29 >> 5;
  puVar26 = puVar29;
  if (0 < lVar32) {
    puVar26 = (pointer)((long)&(puVar29->_M_t).
                               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                               _M_head_impl + ((long)puVar4 - (long)puVar29 & 0xffffffffffffffe0U));
    lVar32 = lVar32 + 1;
    puVar29 = puVar29 + 2;
    do {
      if (puVar29[-2]._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb) {
        puVar29 = puVar29 + -2;
        goto LAB_00538531;
      }
      if (puVar29[-1]._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb) {
        puVar29 = puVar29 + -1;
        goto LAB_00538531;
      }
      if ((puVar29->_M_t).
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb)
      goto LAB_00538531;
      if (puVar29[1]._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb) {
        puVar29 = puVar29 + 1;
        goto LAB_00538531;
      }
      lVar32 = lVar32 + -1;
      puVar29 = puVar29 + 4;
    } while (1 < lVar32);
  }
  lVar32 = (long)puVar4 - (long)puVar26 >> 3;
  if (lVar32 != 1) {
    if (lVar32 != 2) {
      puVar29 = puVar4;
      if ((lVar32 != 3) ||
         (puVar29 = puVar26,
         (puVar26->_M_t).
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb))
      goto LAB_00538531;
      puVar26 = puVar26 + 1;
    }
    puVar29 = puVar26;
    if ((puVar26->_M_t).
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb)
    goto LAB_00538531;
    puVar26 = puVar26 + 1;
  }
  puVar29 = puVar26;
  if ((puVar26->_M_t).
      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl != bb) {
    puVar29 = puVar4;
  }
LAB_00538531:
  if (puVar29 == puVar4) {
    __assert_fail("header_it != fn->end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                  ,0xd1,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
  }
  pIVar17 = (bb->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar14 = 0;
  if (pIVar17->has_result_id_ == true) {
    uVar14 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
  }
  pvVar18 = preds(pCVar12,uVar14);
  if (puVar29 !=
      (pFVar20->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      puVar5 = (pvVar18->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (pvVar18->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      this_00._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (((puVar29->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->label_)._M_t;
      uVar14 = 0;
      if (*(bool *)((long)this_00._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                   0x2d) == true) {
        uVar14 = Instruction::GetSingleWordOperand
                           ((Instruction *)
                            this_00._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl
                            ,(uint)*(bool *)((long)this_00._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                                  .
                                                  super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                                  ._M_head_impl + 0x2c));
      }
      local_d8._0_4_ = uVar14;
      _Var19 = std::
               __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                         (puVar5,puVar6,local_d8);
    } while ((_Var19._M_current ==
              (pvVar18->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish) &&
            (puVar29 = puVar29 + 1,
            puVar29 !=
            (pFVar20->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish));
  }
  pCVar12 = local_70;
  if (puVar29 ==
      (pFVar20->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("latch_block_iter != fn->end() && \"Could not find the latch.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                  ,0xdf,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
  }
  _Var37._M_head_impl =
       (puVar29->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  RemoveSuccessorEdges(local_70,bb);
  ppIVar1 = &(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  ppIVar27 = ppIVar1;
  do {
    local_38.super_iterator.node_ = (iterator)*ppIVar27;
    ppIVar27 = &(((Instruction *)local_38.super_iterator.node_)->
                super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while (((Instruction *)local_38.super_iterator.node_)->opcode_ == OpPhi);
  pFVar20 = (Function *)
            BasicBlock::SplitBasicBlock(bb,local_e8,(uint32_t)label_id.data._M_elems,&local_38);
  if ((local_e8->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::AnalyzeInstDefUse
              ((local_e8->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               (Instruction *)
               (pFVar20->params_).
               super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  RegisterBlock(pCVar12,(BasicBlock *)pFVar20);
  local_d8 = (undefined1  [8])
             (pFVar20->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((local_e8->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    ppBVar21 = std::__detail::
               _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_e8->instr_to_block_,(key_type *)local_d8);
    *ppBVar21 = (mapped_type)pFVar20;
  }
  local_a8._8_8_ = local_e8;
  ppcStack_90 = (code **)std::
                         _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:243:27)>
                         ::_M_invoke;
  _local_98 = std::
              _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:243:27)>
              ::_M_manager;
  auStack_d0 = (undefined1  [8])0x0;
  local_c8._8_8_ =
       std::
       _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
       ::_M_invoke;
  local_c8._0_8_ =
       std::
       _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
       ::_M_manager;
  pIVar17 = (Instruction *)
            (pFVar20->params_).
            super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_d8 = (undefined1  [8])&local_a8;
  local_a8._M_unused._0_8_ = (undefined8)pFVar20;
  if (pIVar17 != (Instruction *)0x0) {
    local_58._M_array = (iterator)pIVar17;
    std::
    _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:243:27)>
    ::_M_invoke(&local_a8,(Instruction **)&local_58);
  }
  pIVar17 = (Instruction *)
            (pFVar20->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
            _vptr_IntrusiveList;
  local_e0 = pFVar20;
  local_48 = ppIVar1;
  if ((pIVar17 != (Instruction *)0x0) &&
     ((pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar17 == (Instruction *)0x0) break;
      pIVar36 = (pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_58._M_array = (iterator)pIVar17;
      if ((PodType  [2])local_c8._0_8_ == (PodType  [2])0x0) goto LAB_00538f2d;
      if ((pIVar36->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar36 = (Instruction *)0x0;
      }
      cVar13 = (*(code *)local_c8._8_8_)(local_d8,&local_58);
      pIVar17 = pIVar36;
    } while (cVar13 != '\0');
  }
  if ((PodType  [2])local_c8._0_8_ != (PodType  [2])0x0) {
    (*(code *)local_c8._0_8_)(local_d8,local_d8,3);
  }
  if ((PodType  [2])_local_98 != (PodType  [2])0x0) {
    (*_local_98)(&local_a8,&local_a8,3);
  }
  pFVar20 = local_e0;
  if (_Var37._M_head_impl == bb) {
    uVar14 = BasicBlock::ContinueBlockId((BasicBlock *)local_e0);
    pIVar17 = (bb->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar15 = 0;
    if (pIVar17->has_result_id_ == true) {
      uVar15 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
    }
    _Var37._M_head_impl = (BasicBlock *)local_e0;
    pFVar20 = (Function *)_Var37._M_head_impl;
    if (uVar14 == uVar15) {
      pIVar17 = BasicBlock::GetLoopMergeInst((BasicBlock *)local_e0);
      local_c8._8_8_ = local_c8;
      local_d8 = (undefined1  [8])&PTR__SmallVector_00b15d78;
      local_b8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_c8._0_4_ = label_id.data._M_elems;
      auStack_d0 = (undefined1  [8])0x1;
      uVar28 = (ulong)(pIVar17->has_result_id_ & 1) + 1;
      if (pIVar17->has_type_id_ == false) {
        uVar28 = (ulong)pIVar17->has_result_id_;
      }
      uVar28 = uVar28 + 1;
      pOVar7 = (pIVar17->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar33 = ((long)(pIVar17->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar7 >> 4) *
               -0x5555555555555555;
      if (uVar33 < uVar28 || uVar33 - uVar28 == 0) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b8,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)&((OperandData *)((pOVar7->words).buffer + -4))->_vptr_SmallVector +
                 (ulong)(uint)((int)uVar28 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_d8);
      local_d8 = (undefined1  [8])&PTR__SmallVector_00b15d78;
      if (local_b8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_b8,local_b8._M_head_impl);
      }
    }
  }
  pIVar3 = local_e8;
  local_a8._M_unused._M_object = (undefined **)0x0;
  local_a8._8_8_ = (IRContext *)0x0;
  local_98.data._M_elems = (array<signed_char,_4UL>)0x0;
  PStack_94.data._M_elems = (array<signed_char,_4UL>)0x0;
  ppcStack_90 = (code **)0x0;
  local_a8._M_unused._M_object = operator_new(0x20);
  (((Function *)local_a8._M_unused._0_8_)->def_inst_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (Instruction *)_Var37._M_head_impl;
  (((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
     *)&(((Function *)local_a8._M_unused._0_8_)->params_).
        super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
  super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>)._M_head_impl = (Instruction *)bb;
  (((Function *)local_a8._M_unused._0_8_)->params_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = &pFVar20->def_inst_;
  (((Function *)local_a8._M_unused._0_8_)->params_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pIVar3;
  ppcStack_90 = (code **)std::
                         _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:257:22)>
                         ::_M_invoke;
  _local_98 = std::
              _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:257:22)>
              ::_M_manager;
  auStack_d0 = (undefined1  [8])0x0;
  local_c8._8_8_ =
       std::
       _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
       ::_M_invoke;
  local_c8._0_8_ =
       std::
       _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
       ::_M_manager;
  pIVar17 = (bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_d8 = (undefined1  [8])&local_a8;
  if ((pIVar17 != (Instruction *)0x0) &&
     ((pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar17 == (Instruction *)0x0) break;
      pIVar36 = (pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      cVar13 = '\0';
      if ((pIVar36->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar36 = (Instruction *)0x0;
      }
      if (pIVar17->opcode_ == OpPhi) {
        local_58._M_array = (iterator)pIVar17;
        if ((PodType  [2])local_c8._0_8_ == (PodType  [2])0x0) {
LAB_00538f2d:
          std::__throw_bad_function_call();
        }
        cVar13 = (*(code *)local_c8._8_8_)(local_d8,&local_58);
        if (cVar13 != '\0') {
          pIVar17 = pIVar36;
        }
      }
    } while (cVar13 != '\0');
  }
  if ((PodType  [2])local_c8._0_8_ != (PodType  [2])0x0) {
    (*(code *)local_c8._0_8_)(local_d8,local_d8,3);
  }
  pFVar20 = local_e0;
  if ((PodType  [2])_local_98 != (PodType  [2])0x0) {
    (*_local_98)(&local_a8,&local_a8,3);
  }
  local_64[2] = 0xf9;
  aVar16._M_elems[0] = '\0';
  aVar16._M_elems[1] = '\0';
  aVar16._M_elems[2] = '\0';
  aVar16._M_elems[3] = '\0';
  local_64[1] = 0;
  local_64[0] = 0;
  pIVar17 = (Instruction *)
            (pFVar20->params_).
            super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (Function *)_Var37._M_head_impl;
  if (pIVar17->has_result_id_ == true) {
    aVar16._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
  }
  ppcStack_90 = (code **)&local_98;
  local_a8._M_unused._M_object = &PTR__SmallVector_00b15d78;
  local_88._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_98.data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar16._M_elems;
  local_a8._8_8_ = 1;
  local_d8._0_4_ = 1;
  auStack_d0 = (undefined1  [8])&PTR__SmallVector_00b15d78;
  local_c8._0_4_ = (array<signed_char,_4UL>)0x0;
  local_c8._4_4_ = (array<signed_char,_4UL>)0x0;
  local_b8._M_head_impl =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_c8 + 8);
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)auStack_d0,
             (SmallVector<unsigned_int,_2UL> *)&local_a8);
  local_58._M_array = (iterator)local_d8;
  local_58._M_len = 1;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*&,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_40,&local_e8,(Op *)(local_64 + 2),local_64 + 1,local_64,&local_58);
  pIVar17 = local_40;
  local_40 = (Instruction *)0x0;
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar17);
  if (local_40 != (Instruction *)0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  ppIVar1 = local_48;
  pCVar12 = local_70;
  local_40 = (Instruction *)0x0;
  auStack_d0 = (undefined1  [8])&PTR__SmallVector_00b15d78;
  if (local_b0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_b0,local_b0._M_head_impl);
  }
  local_b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a8._M_unused._M_object = &PTR__SmallVector_00b15d78;
  if (local_88._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_88,local_88._M_head_impl);
  }
  if ((*ppIVar1 != (Instruction *)0x0) &&
     (((*ppIVar1)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    IRContext::AnalyzeUses
              (local_e8,(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                        super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
    pIVar17 = (bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar17 != (Instruction *)0x0) &&
       ((pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
      local_d8 = (undefined1  [8])
                 (bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
      if ((local_e8->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
        ppBVar21 = std::__detail::
                   _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_e8->instr_to_block_,(key_type *)local_d8);
        *ppBVar21 = bb;
      }
      this_01 = &pCVar12->label2preds_;
      pIVar17 = (Instruction *)
                (pFVar20->params_).
                super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = 0;
      uVar14 = 0;
      if (pIVar17->has_result_id_ == true) {
        uVar14 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
      }
      local_d8._0_4_ = uVar14;
      pmVar22 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_01,(key_type *)local_d8);
      pIVar17 = (bb->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar17->has_result_id_ == true) {
        uVar15 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
      }
      local_a8._0_4_ = uVar15;
      iVar8._M_current =
           (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (pmVar22,iVar8,(uint *)local_a8._M_pod_data);
      }
      else {
        *iVar8._M_current = uVar15;
        (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar8._M_current + 1;
      }
      pFVar20 = local_e0;
      auStack_d0._4_4_ = 0;
      auStack_d0._0_4_ = label_id.data._M_elems;
      local_c8._8_8_ =
           std::
           _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:315:38)>
           ::_M_invoke;
      local_c8._0_8_ =
           std::
           _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:315:38)>
           ::_M_manager;
      local_d8 = (undefined1  [8])bb;
      BasicBlock::ForEachSuccessorLabel
                ((BasicBlock *)local_78,(function<void_(unsigned_int_*)> *)local_d8);
      if ((PodType  [2])local_c8._0_8_ != (PodType  [2])0x0) {
        (*(code *)local_c8._0_8_)(local_d8,local_d8,3);
      }
      pFVar11 = local_78;
      pp_Var9 = (local_78->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
                _vptr_IntrusiveList;
      if ((pp_Var9 != (_func_int **)0x0) && (*(char *)(pp_Var9 + 3) == '\0')) {
        IRContext::AnalyzeUses
                  (local_e8,(Instruction *)
                            (local_78->debug_insts_in_header_).
                            super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                            super_IntrusiveNodeBase<spvtools::opt::Instruction>.
                            _vptr_IntrusiveNodeBase);
        pIVar17 = (Instruction *)
                  (pFVar20->params_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar15 = 0;
        uVar14 = 0;
        if (pIVar17->has_result_id_ == true) {
          uVar14 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
        }
        local_d8._0_4_ = uVar14;
        pmVar22 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_01,(key_type *)local_d8);
        pIVar17 = (Instruction *)
                  (pFVar11->params_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pIVar17->has_result_id_ == true) {
          uVar15 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
        }
        local_a8._0_4_ = uVar15;
        iVar8._M_current =
             (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (pmVar22,iVar8,(uint *)local_a8._M_pod_data);
        }
        else {
          *iVar8._M_current = uVar15;
          (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        pIVar17 = (bb->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar15 = 0;
        uVar14 = 0;
        if (pIVar17->has_result_id_ == true) {
          uVar14 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
        }
        local_d8._0_4_ = uVar14;
        pmVar22 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_01,(key_type *)local_d8);
        puVar5 = (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar6 = (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pIVar17 = (Instruction *)
                  (local_78->params_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pIVar17->has_result_id_ == true) {
          uVar15 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
        }
        local_d8._0_4_ = uVar15;
        __dest = std::
                 __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                           (puVar5,puVar6);
        pFVar20 = local_e0;
        puVar5 = (pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (__dest._M_current == puVar5) {
          __assert_fail("latch_pos != block_preds.end() && \"The cfg was invalid.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                        ,0x147,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
        }
        puVar6 = __dest._M_current + 1;
        if (puVar6 != puVar5) {
          memmove(__dest._M_current,puVar6,(long)puVar5 - (long)puVar6);
        }
        ppuVar2 = &(pmVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar2 = *ppuVar2 + -1;
        if ((local_e8->valid_analyses_ & kAnalysisLoopAnalysis) != kAnalysisNone) {
          pLVar23 = IRContext::GetLoopDescriptor(local_e8,bb->function_);
          pIVar17 = (bb->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar14 = 0;
          if (pIVar17->has_result_id_ == true) {
            uVar14 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
          }
          uVar28 = (pLVar23->basic_block_to_loop_)._M_h._M_bucket_count;
          uVar33 = (ulong)uVar14 % uVar28;
          p_Var34 = (pLVar23->basic_block_to_loop_)._M_h._M_buckets[uVar33];
          p_Var35 = (__node_base_ptr)0x0;
          if ((p_Var34 != (__node_base_ptr)0x0) &&
             (p_Var24 = p_Var34->_M_nxt, p_Var35 = p_Var34,
             *(uint *)&p_Var34->_M_nxt[1]._M_nxt != uVar14)) {
            while (p_Var34 = p_Var24, p_Var24 = p_Var34->_M_nxt, p_Var24 != (_Hash_node_base *)0x0)
            {
              p_Var35 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var24[1]._M_nxt % uVar28 != uVar33) ||
                 (p_Var35 = p_Var34, *(uint *)&p_Var24[1]._M_nxt == uVar14)) goto LAB_00538dbb;
            }
            p_Var35 = (__node_base_ptr)0x0;
          }
LAB_00538dbb:
          if (p_Var35 == (__node_base_ptr)0x0) {
            p_Var24 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var24 = p_Var35->_M_nxt;
          }
          if (p_Var24 == (_Hash_node_base *)0x0) {
            pLVar31 = (Loop *)0x0;
          }
          else {
            pLVar31 = (Loop *)p_Var24[2]._M_nxt;
          }
          this_02 = &pLVar23->basic_block_to_loop_;
          local_a8._0_4_ = label_id.data._M_elems;
          pLVar30 = pLVar31;
          do {
            local_d8 = (undefined1  [8])&pLVar30->loop_basic_blocks_;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      (local_d8,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                 *)&local_a8,local_d8);
            pLVar30 = pLVar30->parent_;
          } while (pLVar30 != (Loop *)0x0);
          pLVar31->loop_header_ = (BasicBlock *)local_e0;
          local_d8._0_4_ = label_id.data._M_elems;
          ppLVar25 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)this_02,(key_type *)local_d8);
          *ppLVar25 = pLVar31;
          pIVar17 = (bb->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar14 = 0;
          if (pIVar17->has_result_id_ == true) {
            uVar14 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
          }
          local_d8._0_4_ = uVar14;
          pLVar30 = pLVar31;
          do {
            std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_erase(&(pLVar30->loop_basic_blocks_)._M_h,local_d8);
            pLVar30 = pLVar30->parent_;
          } while (pLVar30 != (Loop *)0x0);
          Loop::SetPreHeaderBlock(pLVar31,bb);
          pLVar10 = pLVar31->parent_;
          pIVar17 = (bb->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar14 = 0;
          if (pLVar10 == (mapped_type)0x0) {
            if (pIVar17->has_result_id_ != false) {
              uVar14 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
            }
            local_d8._0_4_ = uVar14;
            ppLVar25 = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_02,(key_type *)local_d8);
            *ppLVar25 = (mapped_type)0x0;
            pFVar20 = local_e0;
          }
          else {
            if (pIVar17->has_result_id_ != false) {
              uVar14 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
            }
            local_a8._0_4_ = uVar14;
            pLVar31 = pLVar10;
            do {
              local_d8 = (undefined1  [8])&pLVar31->loop_basic_blocks_;
              std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        (local_d8,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                   *)&local_a8,local_d8);
              pLVar31 = pLVar31->parent_;
            } while (pLVar31 != (Loop *)0x0);
            pIVar17 = (bb->label_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
            uVar14 = 0;
            if (pIVar17->has_result_id_ == true) {
              uVar14 = Instruction::GetSingleWordOperand(pIVar17,(uint)pIVar17->has_type_id_);
            }
            local_d8._0_4_ = uVar14;
            ppLVar25 = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_02,(key_type *)local_d8);
            *ppLVar25 = pLVar10;
            pFVar20 = local_e0;
          }
        }
        return (BasicBlock *)pFVar20;
      }
    }
  }
  __assert_fail("!insts_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
}

Assistant:

BasicBlock* CFG::SplitLoopHeader(BasicBlock* bb) {
  assert(bb->GetLoopMergeInst() && "Expecting bb to be the header of a loop.");

  Function* fn = bb->GetParent();
  IRContext* context = module_->context();

  // Get the new header id up front.  If we are out of ids, then we cannot split
  // the loop.
  uint32_t new_header_id = context->TakeNextId();
  if (new_header_id == 0) {
    return nullptr;
  }

  // Find the insertion point for the new bb.
  Function::iterator header_it = std::find_if(
      fn->begin(), fn->end(),
      [bb](BasicBlock& block_in_func) { return &block_in_func == bb; });
  assert(header_it != fn->end());

  const std::vector<uint32_t>& pred = preds(bb->id());
  // Find the back edge
  BasicBlock* latch_block = nullptr;
  Function::iterator latch_block_iter = header_it;
  for (; latch_block_iter != fn->end(); ++latch_block_iter) {
    // If blocks are in the proper order, then the only branch that appears
    // after the header is the latch.
    if (std::find(pred.begin(), pred.end(), latch_block_iter->id()) !=
        pred.end()) {
      break;
    }
  }
  assert(latch_block_iter != fn->end() && "Could not find the latch.");
  latch_block = &*latch_block_iter;

  RemoveSuccessorEdges(bb);

  // Create the new header bb basic bb.
  // Leave the phi instructions behind.
  auto iter = bb->begin();
  while (iter->opcode() == spv::Op::OpPhi) {
    ++iter;
  }

  BasicBlock* new_header = bb->SplitBasicBlock(context, new_header_id, iter);
  context->AnalyzeDefUse(new_header->GetLabelInst());

  // Update cfg
  RegisterBlock(new_header);

  // Update bb mappings.
  context->set_instr_block(new_header->GetLabelInst(), new_header);
  new_header->ForEachInst([new_header, context](Instruction* inst) {
    context->set_instr_block(inst, new_header);
  });

  // If |bb| was the latch block, the branch back to the header is not in
  // |new_header|.
  if (latch_block == bb) {
    if (new_header->ContinueBlockId() == bb->id()) {
      new_header->GetLoopMergeInst()->SetInOperand(1, {new_header_id});
    }
    latch_block = new_header;
  }

  // Adjust the OpPhi instructions as needed.
  bb->ForEachPhiInst([latch_block, bb, new_header, context](Instruction* phi) {
    std::vector<uint32_t> preheader_phi_ops;
    std::vector<Operand> header_phi_ops;

    // Identify where the original inputs to original OpPhi belong: header or
    // preheader.
    for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
      uint32_t def_id = phi->GetSingleWordInOperand(i);
      uint32_t branch_id = phi->GetSingleWordInOperand(i + 1);
      if (branch_id == latch_block->id()) {
        header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {def_id}});
        header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {branch_id}});
      } else {
        preheader_phi_ops.push_back(def_id);
        preheader_phi_ops.push_back(branch_id);
      }
    }

    // Create a phi instruction if and only if the preheader_phi_ops has more
    // than one pair.
    if (preheader_phi_ops.size() > 2) {
      InstructionBuilder builder(
          context, &*bb->begin(),
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

      Instruction* new_phi = builder.AddPhi(phi->type_id(), preheader_phi_ops);

      // Add the OpPhi to the header bb.
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {new_phi->result_id()}});
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {bb->id()}});
    } else {
      // An OpPhi with a single entry is just a copy.  In this case use the same
      // instruction in the new header.
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {preheader_phi_ops[0]}});
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {bb->id()}});
    }

    phi->RemoveFromList();
    std::unique_ptr<Instruction> phi_owner(phi);
    phi->SetInOperands(std::move(header_phi_ops));
    new_header->begin()->InsertBefore(std::move(phi_owner));
    context->set_instr_block(phi, new_header);
    context->AnalyzeUses(phi);
  });

  // Add a branch to the new header.
  InstructionBuilder branch_builder(
      context, bb,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  bb->AddInstruction(
      MakeUnique<Instruction>(context, spv::Op::OpBranch, 0, 0,
                              std::initializer_list<Operand>{
                                  {SPV_OPERAND_TYPE_ID, {new_header->id()}}}));
  context->AnalyzeUses(bb->terminator());
  context->set_instr_block(bb->terminator(), bb);
  label2preds_[new_header->id()].push_back(bb->id());

  // Update the latch to branch to the new header.
  latch_block->ForEachSuccessorLabel([bb, new_header_id](uint32_t* id) {
    if (*id == bb->id()) {
      *id = new_header_id;
    }
  });
  Instruction* latch_branch = latch_block->terminator();
  context->AnalyzeUses(latch_branch);
  label2preds_[new_header->id()].push_back(latch_block->id());

  auto& block_preds = label2preds_[bb->id()];
  auto latch_pos =
      std::find(block_preds.begin(), block_preds.end(), latch_block->id());
  assert(latch_pos != block_preds.end() && "The cfg was invalid.");
  block_preds.erase(latch_pos);

  // Update the loop descriptors
  if (context->AreAnalysesValid(IRContext::kAnalysisLoopAnalysis)) {
    LoopDescriptor* loop_desc = context->GetLoopDescriptor(bb->GetParent());
    Loop* loop = (*loop_desc)[bb->id()];

    loop->AddBasicBlock(new_header_id);
    loop->SetHeaderBlock(new_header);
    loop_desc->SetBasicBlockToLoop(new_header_id, loop);

    loop->RemoveBasicBlock(bb->id());
    loop->SetPreHeaderBlock(bb);

    Loop* parent_loop = loop->GetParent();
    if (parent_loop != nullptr) {
      parent_loop->AddBasicBlock(bb->id());
      loop_desc->SetBasicBlockToLoop(bb->id(), parent_loop);
    } else {
      loop_desc->SetBasicBlockToLoop(bb->id(), nullptr);
    }
  }
  return new_header;
}